

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O1

int SUNLinSolSetup_SPTFQMR(SUNLinearSolver S,SUNMatrix A)

{
  code *pcVar1;
  int iVar2;
  ulong uVar3;
  
  if (S == (SUNLinearSolver)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    pcVar1 = *(code **)((long)S->content + 0x30);
    uVar3 = 0;
    if (pcVar1 != (code *)0x0) {
      iVar2 = (*pcVar1)(*(undefined8 *)((long)S->content + 0x40));
      if (iVar2 != 0) {
        uVar3 = (long)(iVar2 >> 0x1f) ^ 4;
        *(ulong *)((long)S->content + 0x18) = uVar3;
      }
    }
  }
  return (int)uVar3;
}

Assistant:

int SUNLinSolSetup_SPTFQMR(SUNLinearSolver S, SUNMatrix A)
{
  int ier;
  PSetupFn Psetup;
  void* PData;

  /* Set shortcuts to SPTFQMR memory structures */
  if (S == NULL) return(SUNLS_MEM_NULL);
  Psetup = SPTFQMR_CONTENT(S)->Psetup;
  PData = SPTFQMR_CONTENT(S)->PData;
  
  /* no solver-specific setup is required, but if user-supplied 
     Psetup routine exists, call that here */
  if (Psetup != NULL) {
    ier = Psetup(PData);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ? 
	SUNLS_PSET_FAIL_UNREC : SUNLS_PSET_FAIL_REC;
      return(LASTFLAG(S));
    }
  }
  
  /* return with success */ 
  return(SUNLS_SUCCESS);
}